

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O2

void __thiscall CHud::RenderCheckpoint(CHud *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  IGraphics *pIVar4;
  ITextRender *pIVar5;
  int iVar6;
  int64 iVar7;
  int64 iVar8;
  long lVar9;
  long in_FS_OFFSET;
  undefined4 uVar10;
  float fVar11;
  char aBuf [64];
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  iVar7 = time_get();
  if (this->m_CheckpointTime != 0) {
    lVar9 = iVar7 - this->m_CheckpointTime;
    iVar7 = time_freq();
    if (lVar9 < iVar7 * 4) {
      FormatTimeDiff(aBuf,0x40,this->m_CheckpointDiff,2,true);
      iVar7 = time_freq();
      if (lVar9 == iVar7 * 2 || SBORROW8(lVar9,iVar7 * 2) != lVar9 + iVar7 * -2 < 0) {
        fVar11 = 1.0;
      }
      else {
        iVar7 = time_freq();
        iVar8 = time_freq();
        fVar11 = (float)(iVar7 * 4 - lVar9) / (float)(iVar8 * 2);
      }
      if (this->m_CheckpointDiff < 1) {
        if (this->m_CheckpointDiff < 0) {
          uVar10 = 0x3f000000;
        }
        else {
          uVar10 = 0x3f800000;
        }
        (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface
          [4])(uVar10,0x3f800000,uVar10,fVar11);
      }
      else {
        (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface
          [4])(0x3f800000,0x3f000000,0x3f000000);
      }
      pIVar4 = ((this->super_CComponent).m_pClient)->m_pGraphics;
      iVar1 = pIVar4->m_ScreenWidth;
      iVar2 = pIVar4->m_ScreenHeight;
      if (RenderCheckpoint()::s_Cursor == '\0') {
        iVar6 = __cxa_guard_acquire(&RenderCheckpoint()::s_Cursor);
        if (iVar6 != 0) {
          CTextCursor::CTextCursor(&RenderCheckpoint::s_Cursor,10.0,0);
          __cxa_atexit(CTextCursor::~CTextCursor,&RenderCheckpoint::s_Cursor,&__dso_handle);
          __cxa_guard_release(&RenderCheckpoint()::s_Cursor);
        }
      }
      RenderCheckpoint::s_Cursor.m_Align = 1;
      CTextCursor::Reset(&RenderCheckpoint::s_Cursor,-1);
      RenderCheckpoint::s_Cursor.m_CursorPos.field_1.y = 33.0;
      pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
      RenderCheckpoint::s_Cursor.m_CursorPos.field_0.x = ((float)iVar1 / (float)iVar2) * 300.0 * 0.5
      ;
      (*(pIVar5->super_IInterface)._vptr_IInterface[0xb])
                (pIVar5,&RenderCheckpoint::s_Cursor,aBuf,0xffffffffffffffff);
      (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
                (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CHud::RenderCheckpoint()
{
	int64 TimeSinceCheckpoint = time_get() - m_CheckpointTime;
	if(m_CheckpointTime != 0 && TimeSinceCheckpoint < time_freq() * 4)
	{
		char aBuf[64];
		FormatTimeDiff(aBuf, sizeof(aBuf), m_CheckpointDiff, 2);

		// calculate alpha (2 sec 1 than get lower the next 2 sec)
		float a = 1.0f;
		if(TimeSinceCheckpoint > time_freq() * 2)
		{
			// lower the alpha slowly to blend text out
			a = (time_freq() * 4 - TimeSinceCheckpoint) / (float)(time_freq() * 2);
		}

		if(m_CheckpointDiff > 0)
			TextRender()->TextColor(1.0f,0.5f,0.5f,a); // red
		else if(m_CheckpointDiff < 0)
			TextRender()->TextColor(0.5f,1.0f,0.5f,a); // green
		else if(!m_CheckpointDiff)
			TextRender()->TextColor(1,1,1,a); // white

		float Half = 300.0f*Graphics()->ScreenAspect()/2.0f;
		
		static CTextCursor s_Cursor(10);
		s_Cursor.m_Align = TEXTALIGN_TC;
		s_Cursor.Reset();
		s_Cursor.MoveTo(Half, 33);
		TextRender()->TextOutlined(&s_Cursor, aBuf, -1);

		TextRender()->TextColor(1,1,1,1);
	}
}